

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

bool __thiscall cppforth::Forth::interpretNumbers(Forth *this,string *value)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  Cell CVar4;
  unsigned_long uVar5;
  Cell numericBase;
  char cVar6;
  const_iterator cVar7;
  uint x;
  const_iterator cVar8;
  unsigned_long uVar9;
  double x_00;
  const_iterator returnValue;
  
  CVar4 = getNumericBase(this);
  cVar8._M_current = (value->_M_dataplus)._M_p;
  sVar2 = value->_M_string_length;
  if (sVar2 == 0) goto LAB_00128824;
  if (cVar8._M_current[sVar2 - 1] == '.') {
LAB_00128794:
    if (sVar2 == 1) goto LAB_00128824;
    if (cVar8._M_current[sVar2 - 1] == '.') {
      cVar7._M_current = cVar8._M_current + (value->_M_string_length - 1);
      cVar6 = *cVar8._M_current;
      if ((byte)(cVar6 - 0x23U) < 3) {
        CVar4 = *(Cell *)(&DAT_0012fd10 + (ulong)(byte)(cVar6 - 0x23U) * 4);
        cVar6 = cVar8._M_current[1];
        cVar8._M_current = cVar8._M_current + 1;
      }
      returnValue._M_current = cVar8._M_current + (cVar6 == '-');
      uVar5 = parseUnsignedNumber(returnValue,cVar7,&returnValue,CVar4);
      if (returnValue._M_current != cVar7._M_current) {
        cVar8._M_current = (value->_M_dataplus)._M_p;
        goto LAB_00128806;
      }
      uVar9 = -uVar5;
      if (cVar6 != '-') {
        uVar9 = uVar5;
      }
      CVar4 = getIsCompiling(this);
      x = (uint)(uVar9 >> 0x20);
      if (CVar4 == 0) {
        ForthStack<unsigned_int>::push(&this->dStack,(Cell)uVar9);
        goto LAB_001289e0;
      }
      data(this,1);
      data(this,(Cell)uVar9);
      data(this,1);
      goto LAB_001289aa;
    }
LAB_00128806:
    if (sVar2 == 3) {
      cVar6 = *cVar8._M_current;
      if (cVar6 == '\'') {
        if (cVar8._M_current[2] == '\'') {
          x = (uint)(byte)cVar8._M_current[1];
          goto LAB_001288ed;
        }
        goto LAB_00128824;
      }
    }
    else {
LAB_00128824:
      cVar6 = *cVar8._M_current;
    }
    cVar7._M_current = cVar8._M_current + value->_M_string_length;
    if ((cVar6 == '+') || (cVar6 == '-')) {
      cVar8._M_current = cVar8._M_current + 1;
    }
    returnValue._M_current = cVar8._M_current;
    skipDecimalDigits(cVar8,cVar7,&returnValue);
    if (returnValue._M_current < cVar7._M_current && cVar8._M_current < returnValue._M_current) {
      if (*returnValue._M_current == '.') {
        returnValue._M_current = returnValue._M_current + 1;
        skipDecimalDigits(returnValue,cVar7,&returnValue);
      }
      if ((returnValue._M_current < cVar7._M_current) &&
         (cVar8._M_current = returnValue._M_current + 1, (*returnValue._M_current & 0xdfU) == 0x45))
      {
        if (cVar8._M_current < cVar7._M_current) {
          if ((*cVar8._M_current == 0x2b) || (*cVar8._M_current == 0x2d)) {
            cVar8._M_current = returnValue._M_current + 2;
          }
          returnValue._M_current = cVar8._M_current;
          skipDecimalDigits(cVar8,cVar7,&returnValue);
          cVar8._M_current = returnValue._M_current;
          if (returnValue._M_current != cVar7._M_current) goto LAB_001288d7;
        }
        returnValue._M_current = cVar8._M_current;
        x_00 = std::__cxx11::stod(value,(size_t *)0x0);
        CVar4 = getIsCompiling(this);
        if (CVar4 == 0) {
          ForthStack<double>::push(&this->fStack,x_00);
        }
        else {
          data(this,0x12);
          dataFloat(this,x_00);
        }
        goto LAB_001289e5;
      }
    }
LAB_001288d7:
    bVar3 = false;
  }
  else {
    cVar7._M_current = cVar8._M_current + sVar2;
    cVar6 = *cVar8._M_current;
    bVar1 = cVar6 - 0x23;
    numericBase = CVar4;
    if (bVar1 < 3) {
      cVar6 = cVar8._M_current[1];
      cVar8._M_current = cVar8._M_current + 1;
      numericBase = *(Cell *)(&DAT_0012fd10 + (ulong)bVar1 * 4);
    }
    returnValue._M_current = cVar8._M_current + (cVar6 == '-');
    uVar5 = parseUnsignedNumber(returnValue,cVar7,&returnValue,numericBase);
    if (returnValue._M_current != cVar7._M_current) {
      cVar8._M_current = (value->_M_dataplus)._M_p;
      goto LAB_00128794;
    }
    x = -(uint)uVar5;
    if (cVar6 != '-') {
      x = (uint)uVar5;
    }
LAB_001288ed:
    CVar4 = getIsCompiling(this);
    if (CVar4 == 0) {
LAB_001289e0:
      ForthStack<unsigned_int>::push(&this->dStack,x);
    }
    else {
      data(this,1);
LAB_001289aa:
      data(this,x);
    }
LAB_001289e5:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool interpretNumbers(const std::string &value){
			int base = getNumericBase();
			auto valueSize=value.length();
			bool signNegative{};
			long long numericIntValue{};
			// consider it is signed int
			if(valueSize>0 && value[valueSize-1]!='.'){
				auto begin=value.begin();
				auto end=value.end();
				auto localBase=base;
				auto firstChar=*begin;
				if(firstChar=='#') {localBase=10; ++begin;}
				else if(firstChar=='$') {localBase=16; ++begin;}
				else if(firstChar=='%') {localBase=2; ++begin;}
				firstChar=*begin;
				if(firstChar=='-') {signNegative=true; ++begin;}
				else {signNegative=false;};
				auto returnValue{begin};
				numericIntValue=parseUnsignedNumber(begin,end,returnValue,localBase);
				if(returnValue==end){
					if(signNegative) numericIntValue=-numericIntValue;
					int numberInt{static_cast<int>(numericIntValue)};
					if (getIsCompiling()) {
						data(CELL(doLiteralXt));
						data(numberInt);
					}
					else {
						push(numberInt);
					}
					return true;
				}
			}

			// consider it is double int
			if(valueSize>1 && value[valueSize-1]=='.'){
				auto begin=value.begin();
				auto end=value.end()-1;
				auto localBase=base;
				auto firstChar=*begin;
				if(firstChar=='#') {localBase=10; ++begin;}
				else if(firstChar=='$') {localBase=16; ++begin;}
				else if(firstChar=='%') {localBase=2; ++begin;}
				firstChar=*begin;
				if(firstChar=='-') {signNegative=true; ++begin;}
				else {signNegative=false;};
				auto returnValue{begin};
				numericIntValue=parseUnsignedNumber(begin,end,returnValue,localBase);
				if(returnValue==end){
					if(signNegative) numericIntValue=-numericIntValue;
					SDCell numberD(numericIntValue);
					if (getIsCompiling()) {
						data(CELL(doLiteralXt));
						data(numberD.data_.Cells.lo);
						data(CELL(doLiteralXt));
						data(numberD.data_.Cells.hi);
					}
					else {
						push(numberD.data_.Cells.lo);
						push(numberD.data_.Cells.hi);
					}
					return true;
				}

			}
			// consider it is char
			if (valueSize==3 && value[0]=='\'' and value[2]=='\''){
				unsigned number;
				number = static_cast<unsigned char>(value[1]);
				if (getIsCompiling()) {
					data(CELL(doLiteralXt));
					data(number);
				}
				else {
					push(number);
				}
				return true;
			}			
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
/*
if(0){
			std::smatch m1{};
			bool found{};
			static std::regex regexFloat{ "^[-+]?(([0-9]*[\\.]{0,1}[0-9]+)|([0-9]+[\\.]{0,1}[0-9]*))([eE][-+]?[0-9]*)?$" };
			found = regex_search(value, m1, regexFloat);
			if (found){
				FCell number = std::stod(value);
				if (getIsCompiling()) {
					data(CELL(doFLiteralXt));
					dataFloat(number);
				}
				else {
					fStack.push(number);
				}
				return true;
			}
} else
*/
 			{
				// used for own calculation of value without library function
				//long long significandDigits{},exponentDigits0{};
				//double significandDigits0{};
				bool signNegative{},exponentSignNegative{};
				auto begin=value.begin();
				auto end=value.end();
				auto firstChar=*begin;
				if(firstChar=='-') { signNegative=true; ++begin;}
				else if(firstChar=='+') {signNegative=false; ++begin;}
				auto returnValue{begin};
				// own calculation: significandDigits=parseUnsignedNumber(begin,end,returnValue,10);
				skipDecimalDigits(begin,end,returnValue);
				if(returnValue>begin && returnValue<end){ // value has at least 1 decimal digit
					firstChar=*returnValue;
					if(firstChar=='.'){
						begin=++returnValue;
						// own calculation: significandDigits0=parseUnsignedNumberAsFloat(begin,end,returnValue,10);
						skipDecimalDigits(begin,end,returnValue);
					}
					if(returnValue<end){
						firstChar=*returnValue++;
						if(firstChar=='E' || firstChar=='e'){
							if(returnValue<end){
								firstChar=*returnValue;
								if(firstChar=='-') { exponentSignNegative=true; ++returnValue;}
								else if(firstChar=='+') {exponentSignNegative=false; ++returnValue;}
								begin=returnValue;
								// own calculation: exponentDigits0=parseUnsignedNumber(begin,end,returnValue,10);
								skipDecimalDigits(begin,end,returnValue);
								if(returnValue!=end){
									return false;
								}
								// own calculation: if(exponentSignNegative) exponentDigits0=-exponentDigits0;
							}
							// pattern matched
							// convert numbers to digits;
							
							// own calculation: double significant1=significandDigits;
							// own calculation: significant1+=significandDigits0;
							// own calculation: significant1*=std::pow(10,exponentDigits0);
							// own calculation: if(signNegative) significant1=-significant1;
							
							// standard library function provides better precision
							double significantStd=std::stod(value);
							//if(significant1!=significantStd){static int cnt=0;
							//std::cerr <<++cnt<<" Value "<<value<<" My "<<std::setprecision(20)<<significant1<< " , STD "<<std::setprecision(20)<<significantStd 
							//<<" Diff " <<(significant1-significantStd) 
							//<<std::endl;
							//}
							FCell number = significantStd;
							if (getIsCompiling()) {
								data(CELL(doFLiteralXt));
								dataFloat(number);
							}
							else {
								fStack.push(number);
							}
							return true;


						}
					}
				}
			}

#endif
			return false;
}